

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

csc * csc_done(csc *C,void *w,void *x,c_int ok)

{
  long in_RCX;
  void *in_RDX;
  void *in_RSI;
  csc *in_RDI;
  undefined8 local_8;
  
  free(in_RSI);
  free(in_RDX);
  local_8 = in_RDI;
  if (in_RCX == 0) {
    csc_spfree((csc *)0x2745e8);
    local_8 = (csc *)0x0;
  }
  return local_8;
}

Assistant:

csc* csc_done(csc *C, void *w, void *x, c_int ok) {
  c_free(w);                   /* free workspace */
  c_free(x);
  if (ok) return C;
  else {
    csc_spfree(C);
    return OSQP_NULL;
  }
}